

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_highbd_quantize_sse4.c
# Opt level: O0

uint16_t get_accumulated_eob(__m128i *eob)

{
  longlong lVar1;
  longlong lVar2;
  longlong lVar3;
  undefined1 auVar4 [16];
  uint16_t eobValue;
  __m128i eob_shuffled;
  short sStack_60;
  short sStack_5e;
  short sStack_5c;
  short sStack_5a;
  __m128i *eob_local;
  short sStack_50;
  short sStack_4e;
  short sStack_4c;
  short sStack_4a;
  short local_48;
  short sStack_46;
  short sStack_44;
  short sStack_42;
  short sStack_40;
  short sStack_3e;
  short sStack_3c;
  short sStack_3a;
  short local_38;
  short sStack_36;
  short sStack_34;
  short sStack_32;
  short sStack_30;
  short sStack_2e;
  short sStack_2c;
  short sStack_2a;
  short local_28;
  short sStack_26;
  short sStack_24;
  short sStack_22;
  short sStack_20;
  short sStack_1e;
  short local_18;
  short sStack_16;
  short sStack_14;
  short sStack_12;
  short sStack_10;
  short sStack_e;
  short sStack_c;
  short sStack_a;
  
  lVar3 = (*eob)[1];
  lVar1 = (*eob)[0];
  lVar2 = (*eob)[1];
  local_18 = (short)lVar1;
  sStack_16 = (short)((ulong)lVar1 >> 0x10);
  sStack_14 = (short)((ulong)lVar1 >> 0x20);
  sStack_12 = (short)((ulong)lVar1 >> 0x30);
  sStack_10 = (short)lVar2;
  sStack_e = (short)((ulong)lVar2 >> 0x10);
  sStack_c = (short)((ulong)lVar2 >> 0x20);
  sStack_a = (short)((ulong)lVar2 >> 0x30);
  local_28 = (short)lVar3;
  sStack_26 = (short)((ulong)lVar3 >> 0x10);
  sStack_24 = (short)((ulong)lVar3 >> 0x20);
  sStack_22 = (short)((ulong)lVar3 >> 0x30);
  sStack_20 = (short)(*eob)[0];
  sStack_1e = (short)((ulong)(*eob)[0] >> 0x10);
  *(ushort *)*eob =
       (ushort)(local_18 < local_28) * local_28 | (ushort)(local_18 >= local_28) * local_18;
  *(ushort *)((long)*eob + 2) =
       (ushort)(sStack_16 < sStack_26) * sStack_26 | (ushort)(sStack_16 >= sStack_26) * sStack_16;
  *(ushort *)((long)*eob + 4) =
       (ushort)(sStack_14 < sStack_24) * sStack_24 | (ushort)(sStack_14 >= sStack_24) * sStack_14;
  *(ushort *)((long)*eob + 6) =
       (ushort)(sStack_12 < sStack_22) * sStack_22 | (ushort)(sStack_12 >= sStack_22) * sStack_12;
  *(ushort *)(*eob + 1) =
       (ushort)(sStack_10 < sStack_20) * sStack_20 | (ushort)(sStack_10 >= sStack_20) * sStack_10;
  *(ushort *)((long)*eob + 10) =
       (ushort)(sStack_e < sStack_1e) * sStack_1e | (ushort)(sStack_e >= sStack_1e) * sStack_e;
  *(ushort *)((long)*eob + 0xc) =
       (ushort)(sStack_c < sStack_20) * sStack_20 | (ushort)(sStack_c >= sStack_20) * sStack_c;
  *(ushort *)((long)*eob + 0xe) =
       (ushort)(sStack_a < sStack_1e) * sStack_1e | (ushort)(sStack_a >= sStack_1e) * sStack_a;
  auVar4 = pshuflw((undefined1  [16])*eob,(undefined1  [16])*eob,0xe);
  lVar1 = (*eob)[0];
  lVar2 = (*eob)[1];
  local_38 = (short)lVar1;
  sStack_36 = (short)((ulong)lVar1 >> 0x10);
  sStack_34 = (short)((ulong)lVar1 >> 0x20);
  sStack_32 = (short)((ulong)lVar1 >> 0x30);
  sStack_30 = (short)lVar2;
  sStack_2e = (short)((ulong)lVar2 >> 0x10);
  sStack_2c = (short)((ulong)lVar2 >> 0x20);
  sStack_2a = (short)((ulong)lVar2 >> 0x30);
  local_48 = auVar4._0_2_;
  sStack_46 = auVar4._2_2_;
  sStack_44 = auVar4._4_2_;
  sStack_42 = auVar4._6_2_;
  sStack_40 = auVar4._8_2_;
  sStack_3e = auVar4._10_2_;
  sStack_3c = auVar4._12_2_;
  sStack_3a = auVar4._14_2_;
  *(ushort *)*eob =
       (ushort)(local_38 < local_48) * local_48 | (ushort)(local_38 >= local_48) * local_38;
  *(ushort *)((long)*eob + 2) =
       (ushort)(sStack_36 < sStack_46) * sStack_46 | (ushort)(sStack_36 >= sStack_46) * sStack_36;
  *(ushort *)((long)*eob + 4) =
       (ushort)(sStack_34 < sStack_44) * sStack_44 | (ushort)(sStack_34 >= sStack_44) * sStack_34;
  *(ushort *)((long)*eob + 6) =
       (ushort)(sStack_32 < sStack_42) * sStack_42 | (ushort)(sStack_32 >= sStack_42) * sStack_32;
  *(ushort *)(*eob + 1) =
       (ushort)(sStack_30 < sStack_40) * sStack_40 | (ushort)(sStack_30 >= sStack_40) * sStack_30;
  *(ushort *)((long)*eob + 10) =
       (ushort)(sStack_2e < sStack_3e) * sStack_3e | (ushort)(sStack_2e >= sStack_3e) * sStack_2e;
  *(ushort *)((long)*eob + 0xc) =
       (ushort)(sStack_2c < sStack_3c) * sStack_3c | (ushort)(sStack_2c >= sStack_3c) * sStack_2c;
  *(ushort *)((long)*eob + 0xe) =
       (ushort)(sStack_2a < sStack_3a) * sStack_3a | (ushort)(sStack_2a >= sStack_3a) * sStack_2a;
  auVar4 = pshuflw((undefined1  [16])*eob,(undefined1  [16])*eob,1);
  lVar1 = (*eob)[0];
  lVar2 = (*eob)[1];
  eob_local._0_2_ = (short)lVar1;
  eob_local._2_2_ = (short)((ulong)lVar1 >> 0x10);
  eob_local._4_2_ = (short)((ulong)lVar1 >> 0x20);
  eob_local._6_2_ = (short)((ulong)lVar1 >> 0x30);
  sStack_50 = (short)lVar2;
  sStack_4e = (short)((ulong)lVar2 >> 0x10);
  sStack_4c = (short)((ulong)lVar2 >> 0x20);
  sStack_4a = (short)((ulong)lVar2 >> 0x30);
  eob_shuffled[1]._0_2_ = auVar4._0_2_;
  eob_shuffled[1]._2_2_ = auVar4._2_2_;
  eob_shuffled[1]._4_2_ = auVar4._4_2_;
  eob_shuffled[1]._6_2_ = auVar4._6_2_;
  sStack_60 = auVar4._8_2_;
  sStack_5e = auVar4._10_2_;
  sStack_5c = auVar4._12_2_;
  sStack_5a = auVar4._14_2_;
  *(ushort *)*eob =
       (ushort)((short)eob_local < (short)eob_shuffled[1]) * (short)eob_shuffled[1] |
       (ushort)((short)eob_local >= (short)eob_shuffled[1]) * (short)eob_local;
  *(ushort *)((long)*eob + 2) =
       (ushort)(eob_local._2_2_ < eob_shuffled[1]._2_2_) * eob_shuffled[1]._2_2_ |
       (ushort)(eob_local._2_2_ >= eob_shuffled[1]._2_2_) * eob_local._2_2_;
  *(ushort *)((long)*eob + 4) =
       (ushort)(eob_local._4_2_ < eob_shuffled[1]._4_2_) * eob_shuffled[1]._4_2_ |
       (ushort)(eob_local._4_2_ >= eob_shuffled[1]._4_2_) * eob_local._4_2_;
  *(ushort *)((long)*eob + 6) =
       (ushort)(eob_local._6_2_ < eob_shuffled[1]._6_2_) * eob_shuffled[1]._6_2_ |
       (ushort)(eob_local._6_2_ >= eob_shuffled[1]._6_2_) * eob_local._6_2_;
  *(ushort *)(*eob + 1) =
       (ushort)(sStack_50 < sStack_60) * sStack_60 | (ushort)(sStack_50 >= sStack_60) * sStack_50;
  *(ushort *)((long)*eob + 10) =
       (ushort)(sStack_4e < sStack_5e) * sStack_5e | (ushort)(sStack_4e >= sStack_5e) * sStack_4e;
  *(ushort *)((long)*eob + 0xc) =
       (ushort)(sStack_4c < sStack_5c) * sStack_5c | (ushort)(sStack_4c >= sStack_5c) * sStack_4c;
  *(ushort *)((long)*eob + 0xe) =
       (ushort)(sStack_4a < sStack_5a) * sStack_5a | (ushort)(sStack_4a >= sStack_5a) * sStack_4a;
  return (uint16_t)(int)(*eob)[0];
}

Assistant:

static inline uint16_t get_accumulated_eob(__m128i *eob) {
  __m128i eob_shuffled;
  uint16_t eobValue;
  eob_shuffled = _mm_shuffle_epi32(*eob, 0xe);
  *eob = _mm_max_epi16(*eob, eob_shuffled);
  eob_shuffled = _mm_shufflelo_epi16(*eob, 0xe);
  *eob = _mm_max_epi16(*eob, eob_shuffled);
  eob_shuffled = _mm_shufflelo_epi16(*eob, 0x1);
  *eob = _mm_max_epi16(*eob, eob_shuffled);
  eobValue = _mm_extract_epi16(*eob, 0);
  return eobValue;
}